

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_bool32 drwav_init(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData)

{
  drwav_bool32 dVar1;
  size_t sVar2;
  bool bVar3;
  drwav_uint64 blockCount_1;
  drwav_uint64 blockCount;
  undefined1 local_1b8 [4];
  drwav_uint32 sampleCount;
  drwav__chunk_header header;
  drwav_uint64 dataSize;
  drwav_uint64 sampleCountFromFactChunk;
  undefined1 local_180 [6];
  unsigned_short translatedFormatTag;
  drwav_fmt fmt;
  drwav_uint8 wave_1 [16];
  ulong local_140;
  uchar chunkSize_1 [8];
  uchar wave [4];
  uint chunkSize;
  uchar chunkSizeBytes [4];
  int i;
  drwav_uint8 riff2 [12];
  uchar riff [4];
  void *pUserData_local;
  drwav_seek_proc onSeek_local;
  drwav_read_proc onRead_local;
  drwav *pWav_local;
  drwav_uint32 *b32_2;
  drwav_uint32 *a32_2;
  drwav_uint32 *b32_1;
  drwav_uint32 *a32_1;
  drwav_uint32 *b32;
  drwav_uint32 *a32;
  int n_2;
  int n_1;
  int n;
  
  if ((onRead != (drwav_read_proc)0x0) && (onSeek != (drwav_seek_proc)0x0)) {
    unique0x1000070f = pUserData;
    memset(pWav,0,0x150);
    sVar2 = (*onRead)(stack0xfffffffffffffee8,riff2 + 4,4);
    if (sVar2 == 4) {
      bVar3 = false;
      if (((riff2[4] == 'R') && (bVar3 = false, riff2[5] == 'I')) &&
         (bVar3 = false, riff2[6] == 'F')) {
        bVar3 = riff2[7] == 'F';
      }
      if (bVar3) {
        pWav->container = drwav_container_riff;
      }
      else {
        bVar3 = false;
        if (((riff2[4] == 'r') && (bVar3 = false, riff2[5] == 'i')) &&
           (bVar3 = false, riff2[6] == 'f')) {
          bVar3 = riff2[7] == 'f';
        }
        if (!bVar3) {
          return 0;
        }
        pWav->container = drwav_container_w64;
        sVar2 = (*onRead)(stack0xfffffffffffffee8,chunkSizeBytes,0xc);
        if (sVar2 != 0xc) {
          return 0;
        }
        for (chunkSize = 0; (int)chunkSize < 0xc; chunkSize = chunkSize + 1) {
          if (chunkSizeBytes[(int)chunkSize] != drwavGUID_W64_RIFF[(int)(chunkSize + 4)]) {
            return 0;
          }
        }
      }
      if (pWav->container == drwav_container_riff) {
        sVar2 = (*onRead)(stack0xfffffffffffffee8,wave,4);
        if (sVar2 != 4) {
          return 0;
        }
        if ((uint)wave < 0x24) {
          return 0;
        }
        sVar2 = (*onRead)(stack0xfffffffffffffee8,chunkSize_1,4);
        if (sVar2 != 4) {
          return 0;
        }
        bVar3 = false;
        if (((chunkSize_1[0] == 'W') && (bVar3 = false, chunkSize_1[1] == 'A')) &&
           (bVar3 = false, chunkSize_1[2] == 'V')) {
          bVar3 = chunkSize_1[3] == 'E';
        }
        if (!bVar3) {
          return 0;
        }
        pWav->dataChunkDataPos = 0xc;
      }
      else {
        sVar2 = (*onRead)(stack0xfffffffffffffee8,&local_140,8);
        if (sVar2 != 8) {
          return 0;
        }
        if (local_140 < 0x50) {
          return 0;
        }
        sVar2 = (*onRead)(stack0xfffffffffffffee8,fmt.subFormat + 8,0x10);
        if (sVar2 != 0x10) {
          return 0;
        }
        bVar3 = false;
        if (((fmt.subFormat._8_4_ == 0x65766177) &&
            (bVar3 = false, fmt.subFormat._12_4_ == 0x11d3acf3)) &&
           (bVar3 = false, wave_1._0_4_ == 0xc000d18c)) {
          bVar3 = wave_1._4_4_ == 0x8adb8e4f;
        }
        if (!bVar3) {
          return 0;
        }
        pWav->dataChunkDataPos = 0x28;
      }
      dVar1 = drwav__read_fmt(onRead,onSeek,stack0xfffffffffffffee8,pWav->container,
                              &pWav->dataChunkDataPos,(drwav_fmt *)local_180);
      if (((dVar1 != 0) && (stack0xfffffffffffffe84 != 0)) &&
         ((local_180._2_2_ != 0 && ((fmt.sampleRate._2_2_ != 0 && ((ushort)fmt.sampleRate != 0))))))
      {
        sampleCountFromFactChunk._6_2_ = local_180._0_2_;
        if (local_180._0_2_ == 0xfffe) {
          sampleCountFromFactChunk._6_2_ = fmt.extendedSize;
        }
        dataSize = 0;
        while (dVar1 = drwav__read_chunk_header
                                 (onRead,stack0xfffffffffffffee8,pWav->container,
                                  &pWav->dataChunkDataPos,(drwav__chunk_header *)local_1b8),
              dVar1 != 0) {
          header._24_8_ = header.id._8_8_;
          if (pWav->container == drwav_container_riff) {
            bVar3 = false;
            if (((((uint)local_1b8 & 0xff) == 100) && (bVar3 = false, local_1b8[1] == 'a')) &&
               (bVar3 = false, local_1b8[2] == 't')) {
              bVar3 = local_1b8[3] == 'a';
            }
            if (bVar3) {
LAB_0010bc0d:
              pWav->onRead = onRead;
              pWav->onSeek = onSeek;
              pWav->pUserData = stack0xfffffffffffffee8;
              memcpy(&pWav->fmt,local_180,0x28);
              pWav->sampleRate = stack0xfffffffffffffe84;
              pWav->channels = local_180._2_2_;
              pWav->bitsPerSample = fmt.sampleRate._2_2_;
              pWav->bytesPerSample =
                   (drwav_uint16)
                   ((ulong)(ushort)fmt.sampleRate / (ulong)(long)(int)(uint)(ushort)local_180._2_2_)
              ;
              pWav->bytesRemaining = header._24_8_;
              pWav->translatedFormatTag = sampleCountFromFactChunk._6_2_;
              pWav->dataChunkDataSize = header._24_8_;
              if (pWav->bytesPerSample == 0) {
                return 0;
              }
              if (dataSize == 0) {
                pWav->totalSampleCount = (ulong)header._24_8_ / (ulong)pWav->bytesPerSample;
                if (pWav->translatedFormatTag == 2) {
                  pWav->totalSampleCount =
                       ((ulong)header._24_8_ / (ulong)(ushort)fmt.sampleRate) *
                       (long)(int)((uint)(ushort)fmt.sampleRate + (uint)pWav->channels * -6) * 2;
                }
                if (pWav->translatedFormatTag == 0x11) {
                  pWav->totalSampleCount =
                       ((ulong)header._24_8_ / (ulong)(ushort)fmt.sampleRate) *
                       (long)(int)((uint)(ushort)fmt.sampleRate + (uint)pWav->channels * -4) * 2 +
                       ((ulong)header._24_8_ / (ulong)(ushort)fmt.sampleRate) *
                       (ulong)pWav->channels;
                }
              }
              else {
                pWav->totalSampleCount = dataSize * (ushort)local_180._2_2_;
              }
              if (pWav->translatedFormatTag == 2 || pWav->translatedFormatTag == 0x11) {
                pWav->bytesPerSample = 0;
              }
              if (((pWav->translatedFormatTag == 2) || (pWav->translatedFormatTag == 0x11)) &&
                 (2 < pWav->channels)) {
                return 0;
              }
              return 1;
            }
          }
          else {
            bVar3 = false;
            if (((local_1b8 == (undefined1  [4])0x61746164) &&
                (bVar3 = false, sampleCount == 0x11d3acf3)) &&
               (bVar3 = false, header.id.fourcc == (drwav_uint8  [4])0xc000d18c)) {
              bVar3 = header.id._4_4_ == 0x8adb8e4f;
            }
            if (bVar3) goto LAB_0010bc0d;
          }
          if (pWav->container == drwav_container_riff) {
            bVar3 = false;
            if (((((uint)local_1b8 & 0xff) == 0x66) && (bVar3 = false, local_1b8[1] == 'a')) &&
               (bVar3 = false, local_1b8[2] == 'c')) {
              bVar3 = local_1b8[3] == 't';
            }
            if (bVar3) {
              sVar2 = (*onRead)(stack0xfffffffffffffee8,(void *)((long)&blockCount + 4),4);
              if (sVar2 != 4) {
                return 0;
              }
              pWav->dataChunkDataPos = pWav->dataChunkDataPos + 4;
              header._24_8_ = header._24_8_ + -4;
              if (pWav->translatedFormatTag == 2) {
                dataSize = (drwav_uint64)blockCount._4_4_;
              }
              else {
                dataSize = 0;
              }
            }
          }
          else {
            bVar3 = false;
            if (((local_1b8 == (undefined1  [4])0x74636166) &&
                (bVar3 = false, sampleCount == 0x11d3acf3)) &&
               (bVar3 = false, header.id.fourcc == (drwav_uint8  [4])0xc000d18c)) {
              bVar3 = header.id._4_4_ == 0x8adb8e4f;
            }
            if (bVar3) {
              sVar2 = (*onRead)(stack0xfffffffffffffee8,&dataSize,8);
              if (sVar2 != 8) {
                return 0;
              }
              pWav->dataChunkDataPos = pWav->dataChunkDataPos + 4;
              header._24_8_ = header._24_8_ + -8;
            }
          }
          header._24_8_ = (ulong)(uint)header.sizeInBytes + header._24_8_;
          drwav__seek_forward(onSeek,header._24_8_,stack0xfffffffffffffee8);
          pWav->dataChunkDataPos = header._24_8_ + pWav->dataChunkDataPos;
        }
      }
    }
  }
  return 0;
}

Assistant:

drwav_bool32 drwav_init(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData) {
    if (onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    drwav_zero_memory(pWav, sizeof(*pWav));


    // The first 4 bytes should be the RIFF identifier.
    unsigned char riff[4];
    if (onRead(pUserData, riff, sizeof(riff)) != sizeof(riff)) {
        return DRWAV_FALSE;  // Failed to read data.
    }

    // The first 4 bytes can be used to identify the container. For RIFF files it will start with "RIFF" and for
    // w64 it will start with "riff".
    if (drwav__fourcc_equal(riff, "RIFF")) {
        pWav->container = drwav_container_riff;
    } else if (drwav__fourcc_equal(riff, "riff")) {
        pWav->container = drwav_container_w64;

        // Check the rest of the GUID for validity.
        drwav_uint8 riff2[12];
        if (onRead(pUserData, riff2, sizeof(riff2)) != sizeof(riff2)) {
            return DRWAV_FALSE;
        }

        for (int i = 0; i < 12; ++i) {
            if (riff2[i] != drwavGUID_W64_RIFF[i + 4]) {
                return DRWAV_FALSE;
            }
        }
    } else {
        return DRWAV_FALSE;  // Unknown or unsupported container.
    }


    if (pWav->container == drwav_container_riff) {
        // RIFF/WAVE
        unsigned char chunkSizeBytes[4];
        if (onRead(pUserData, chunkSizeBytes, sizeof(chunkSizeBytes)) != sizeof(chunkSizeBytes)) {
            return DRWAV_FALSE;
        }

        unsigned int chunkSize = drwav__bytes_to_u32(chunkSizeBytes);
        if (chunkSize < 36) {
            return DRWAV_FALSE;  // Chunk size should always be at least 36 bytes.
        }

        unsigned char wave[4];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__fourcc_equal(wave, "WAVE")) {
            return DRWAV_FALSE;  // Expecting "WAVE".
        }

        pWav->dataChunkDataPos = 4 + sizeof(chunkSizeBytes) + sizeof(wave);
    } else {
        // W64
        unsigned char chunkSize[8];
        if (onRead(pUserData, chunkSize, sizeof(chunkSize)) != sizeof(chunkSize)) {
            return DRWAV_FALSE;
        }

        if (drwav__bytes_to_u64(chunkSize) < 80) {
            return DRWAV_FALSE;
        }

        drwav_uint8 wave[16];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__guid_equal(wave, drwavGUID_W64_WAVE)) {
            return DRWAV_FALSE;
        }

        pWav->dataChunkDataPos = 16 + sizeof(chunkSize) + sizeof(wave);
    }


    // The next 24 bytes should be the "fmt " chunk.
    drwav_fmt fmt;
    if (!drwav__read_fmt(onRead, onSeek, pUserData, pWav->container, &pWav->dataChunkDataPos, &fmt)) {
        return DRWAV_FALSE;  // Failed to read the "fmt " chunk.
    }

    // Basic validation.
    if (fmt.sampleRate == 0 || fmt.channels == 0 || fmt.bitsPerSample == 0 || fmt.blockAlign == 0) {
        return DRWAV_FALSE;  // Invalid channel count. Probably an invalid WAV file.
    }


    // Translate the internal format.
    unsigned short translatedFormatTag = fmt.formatTag;
    if (translatedFormatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
        translatedFormatTag = drwav__bytes_to_u16(fmt.subFormat + 0);
    }


    drwav_uint64 sampleCountFromFactChunk = 0;

    // The next chunk we care about is the "data" chunk. This is not necessarily the next chunk so we'll need to loop.
    drwav_uint64 dataSize;
    for (;;) {
        drwav__chunk_header header;
        if (!drwav__read_chunk_header(onRead, pUserData, pWav->container, &pWav->dataChunkDataPos, &header)) {
            return DRWAV_FALSE;
        }

        dataSize = header.sizeInBytes;
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "data")) {
                break;
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_DATA)) {
                break;
            }
        }

        // Optional. Get the total sample count from the FACT chunk. This is useful for compressed formats.
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "fact")) {
                drwav_uint32 sampleCount;
                if (onRead(pUserData, &sampleCount, 4) != 4) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 4;

                // The sample count in the "fact" chunk is either unreliable, or I'm not understanding it properly. For
                // now I am only enabling this for Microsoft ADPCM formats.
                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    sampleCountFromFactChunk = sampleCount;
                } else {
                    sampleCountFromFactChunk = 0;
                }
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_FACT)) {
                if (onRead(pUserData, &sampleCountFromFactChunk, 8) != 8) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 8;
            }
        }

        // If we get here it means we didn't find the "data" chunk. Seek past it.

        // Make sure we seek past the padding.
        dataSize += header.paddingSize;
        drwav__seek_forward(onSeek, dataSize, pUserData);
        pWav->dataChunkDataPos += dataSize;
    }

    // At this point we should be sitting on the first byte of the raw audio data.

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt = fmt;
    pWav->sampleRate = fmt.sampleRate;
    pWav->channels = fmt.channels;
    pWav->bitsPerSample = fmt.bitsPerSample;
    pWav->bytesPerSample = fmt.blockAlign / fmt.channels;
    pWav->bytesRemaining = dataSize;
    pWav->translatedFormatTag = translatedFormatTag;
    pWav->dataChunkDataSize = dataSize;

    // The bytes per sample should never be 0 at this point. This would indicate an invalid WAV file.
    if (pWav->bytesPerSample == 0) {
        return DRWAV_FALSE;
    }

    if (sampleCountFromFactChunk != 0) {
        pWav->totalSampleCount = sampleCountFromFactChunk * fmt.channels;
    } else {
        pWav->totalSampleCount = dataSize / pWav->bytesPerSample;

        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
        }
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
        }
    }

    // The way we calculate the bytes per sample does not make sense for compressed formats so we just set it to 0.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->bytesPerSample = 0;
    }

    // Some formats only support a certain number of channels.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        if (pWav->channels > 2) {
            return DRWAV_FALSE;
        }
    }

#ifdef DR_WAV_LIBSNDFILE_COMPAT
    // I use libsndfile as a benchmark for testing, however in the version I'm using (from the Windows installer on the
    // libsndfile website), it appears the total sample count libsndfile uses for MS-ADPCM is incorrect. It would seem
    // they are computing the total sample count from the number of blocks, however this results in the inclusion of the
    // extra silent samples at the end of the last block. The correct way to know the total sample count is to inspect
    // the "fact" chunk which should always be present for compressed formats, and should always include the sample
    // count. This little block of code below is only used to emulate the libsndfile logic so I can properly run my
    // correctness tests against libsndfile, and is disabled by default.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
    }
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
    }
#endif

    return DRWAV_TRUE;
}